

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O2

void __thiscall
tchecker::typed_while_statement_t::typed_while_statement_t
          (typed_while_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_expression_t> *cond,
          shared_ptr<const_tchecker::typed_statement_t> *stmt)

{
  shared_ptr<const_tchecker::statement_t> sStack_48;
  __shared_ptr<tchecker::expression_t_const,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  *(undefined ***)&this->super_typed_statement_t = &PTR__typed_statement_t_0022c028;
  (this->super_typed_statement_t)._type = type;
  std::__shared_ptr<tchecker::expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_expression_t_const,void>
            (local_38,&cond->
                       super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<tchecker::statement_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_statement_t_const,void>
            ((__shared_ptr<tchecker::statement_t_const,(__gnu_cxx::_Lock_policy)2> *)&sStack_48,
             &stmt->
              super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>);
  while_statement_t::while_statement_t
            (&this->super_while_statement_t,&PTR_construction_vtable_56__0022b130,
             (shared_ptr<const_tchecker::expression_t> *)local_38,&sStack_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_48.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  *(undefined8 *)&this->super_typed_statement_t = 0x22b078;
  *(undefined8 *)&this->super_while_statement_t = 0x22b0e8;
  return;
}

Assistant:

typed_while_statement_t::typed_while_statement_t(enum tchecker::statement_type_t type,
                                                 std::shared_ptr<tchecker::typed_expression_t const> const & cond,
                                                 std::shared_ptr<tchecker::typed_statement_t const> const & stmt)
    : tchecker::typed_statement_t(type), tchecker::while_statement_t(cond, stmt)
{
}